

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::draw_elements_instanced_base_vertex_invalid_map
               (NegativeTestContext *ctx)

{
  allocator<char> local_41;
  GLuint buf;
  GLfloat vertices [1];
  string local_38;
  
  buf = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to an enabled array or the element array and the buffer object\'s data store is currently mapped."
             ,&local_41);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&buf);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8893,buf);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8893,10,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glMapBufferRange(&ctx->super_CallLogWrapper,0x8893,0,5,1);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glDrawElementsInstancedBaseVertex
            (&ctx->super_CallLogWrapper,0,1,0x1405,vertices,1,1);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUnmapBuffer(&ctx->super_CallLogWrapper,0x8893);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&buf);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void draw_elements_instanced_base_vertex_invalid_map (NegativeTestContext& ctx)
{
	GLfloat						vertices[1];
	GLuint						buf		= 0;

	ctx.beginSection("GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to an enabled array or the element array and the buffer object's data store is currently mapped.");
	ctx.glGenBuffers(1, &buf);
	ctx.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buf);
	ctx.glBufferData(GL_ELEMENT_ARRAY_BUFFER, 10, 0, GL_STATIC_DRAW);
	ctx.glMapBufferRange(GL_ELEMENT_ARRAY_BUFFER, 0, 5, GL_MAP_READ_BIT);
	ctx.expectError(GL_NO_ERROR);
	ctx.glDrawElementsInstancedBaseVertex(GL_POINTS, 1, GL_UNSIGNED_INT, vertices, 1, 1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUnmapBuffer(GL_ELEMENT_ARRAY_BUFFER);
	ctx.glDeleteBuffers(1, &buf);
	ctx.endSection();

}